

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O2

void yprp_type(lys_ypr_ctx_conflict *pctx,lysp_type *type)

{
  uint16_t *puVar1;
  ushort uVar2;
  lysp_type *plVar3;
  lysp_ext_instance *plVar4;
  char *pcVar5;
  ulong uVar6;
  int8_t *flag_00;
  char *pcVar7;
  lysp_restr *plVar8;
  lysp_ext_instance *flag_01;
  long lVar9;
  lysp_ext_instance *plVar10;
  ulong uVar11;
  int8_t flag;
  
  flag = '\0';
  if (type != (lysp_type *)0x0 && pctx != (lys_ypr_ctx_conflict *)0x0) {
    ypr_open(pctx,"type","name",type->name,'\0');
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 + 1;
    flag_01 = (lysp_ext_instance *)&flag;
    yprp_extension_instances(pctx,LY_STMT_TYPE,'\0',type->exts,(int8_t *)flag_01);
    if ((((type->range == (lysp_restr *)0x0) && (type->length == (lysp_restr *)0x0)) &&
        (type->patterns == (lysp_restr *)0x0)) &&
       ((type->bits == (lysp_type_enum *)0x0 && (type->enums == (lysp_type_enum *)0x0)))) {
      plVar8 = (lysp_restr *)0x0;
    }
    else {
      ypr_close_parent(pctx,&flag);
      plVar8 = type->range;
    }
    yprp_restr(pctx,plVar8,LY_STMT_RANGE,"value",(int8_t *)flag_01);
    flag_00 = "value";
    yprp_restr(pctx,type->length,LY_STMT_LENGTH,"value",(int8_t *)flag_01);
    lVar9 = 0;
    plVar10 = (lysp_ext_instance *)0x0;
    while( true ) {
      plVar8 = type->patterns;
      if (plVar8 == (lysp_restr *)0x0) {
        plVar4 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar4 = plVar8[-1].exts;
      }
      if (plVar4 <= plVar10) break;
      flag_00 = "value";
      yprp_restr(pctx,(lysp_restr *)((long)&(plVar8->arg).str + lVar9),LY_STMT_PATTERN,"value",
                 (int8_t *)flag_01);
      plVar10 = (lysp_ext_instance *)((long)&plVar10->name + 1);
      lVar9 = lVar9 + 0x40;
    }
    yprp_enum(pctx,type->bits,LY_TYPE_BITS,flag_00);
    yprp_enum(pctx,type->enums,LY_TYPE_ENUM,flag_00);
    if (type->path != (lyxp_expr *)0x0) {
      ypr_close_parent(pctx,&flag);
      flag_01 = type->exts;
      ypr_substmt(pctx,LY_STMT_PATH,'\0',type->path->expr,flag_01);
    }
    uVar2 = type->flags;
    if ((uVar2 >> 9 & 1) != 0) {
      ypr_close_parent(pctx,&flag);
      pcVar7 = "true";
      if (type->require_instance == '\0') {
        pcVar7 = "false";
      }
      flag_01 = type->exts;
      ypr_substmt(pctx,LY_STMT_REQUIRE_INSTANCE,'\0',pcVar7,flag_01);
      uVar2 = type->flags;
    }
    if ((uVar2 & 8) != 0) {
      ypr_close_parent(pctx,&flag);
      ypr_unsigned(pctx,LY_STMT_FRACTION_DIGITS,(uint8_t)type->exts,
                   (void *)(ulong)type->fraction_digits,(unsigned_long)flag_01);
    }
    pcVar7 = (char *)0x0;
    while( true ) {
      if (type->bases == (char **)0x0) {
        pcVar5 = (char *)0x0;
      }
      else {
        pcVar5 = type->bases[-1];
      }
      if (pcVar5 <= pcVar7) break;
      ypr_close_parent(pctx,&flag);
      ypr_substmt(pctx,LY_STMT_BASE,(uint8_t)pcVar7,type->bases[(long)pcVar7],type->exts);
      pcVar7 = pcVar7 + 1;
    }
    lVar9 = 0;
    uVar11 = 0;
    while( true ) {
      plVar3 = type->types;
      if (plVar3 == (lysp_type *)0x0) {
        uVar6 = 0;
      }
      else {
        uVar6._0_1_ = plVar3[-1].fraction_digits;
        uVar6._1_1_ = plVar3[-1].require_instance;
        uVar6._2_2_ = plVar3[-1].flags;
        uVar6._4_4_ = *(undefined4 *)&plVar3[-1].field_0x64;
      }
      if (uVar6 <= uVar11) break;
      ypr_close_parent(pctx,&flag);
      yprp_type(pctx,(lysp_type *)((long)&type->types->name + lVar9));
      uVar11 = uVar11 + 1;
      lVar9 = lVar9 + 0x68;
    }
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 - 1;
    ypr_close(pctx,"type",flag);
  }
  return;
}

Assistant:

static void
yprp_type(struct lys_ypr_ctx *pctx, const struct lysp_type *type)
{
    LY_ARRAY_COUNT_TYPE u;
    int8_t flag = 0;

    if (!pctx || !type) {
        return;
    }

    ypr_open(pctx, "type", "name", type->name, flag);
    LEVEL++;

    yprp_extension_instances(pctx, LY_STMT_TYPE, 0, type->exts, &flag);

    if (type->range || type->length || type->patterns || type->bits || type->enums) {
        ypr_close_parent(pctx, &flag);
    }
    yprp_restr(pctx, type->range, LY_STMT_RANGE, "value", &flag);
    yprp_restr(pctx, type->length, LY_STMT_LENGTH, "value", &flag);
    LY_ARRAY_FOR(type->patterns, u) {
        yprp_restr(pctx, &type->patterns[u], LY_STMT_PATTERN, "value", &flag);
    }
    yprp_enum(pctx, type->bits, LY_TYPE_BITS, &flag);
    yprp_enum(pctx, type->enums, LY_TYPE_ENUM, &flag);

    if (type->path) {
        ypr_close_parent(pctx, &flag);
        ypr_substmt(pctx, LY_STMT_PATH, 0, type->path->expr, type->exts);
    }
    if (type->flags & LYS_SET_REQINST) {
        ypr_close_parent(pctx, &flag);
        ypr_substmt(pctx, LY_STMT_REQUIRE_INSTANCE, 0, type->require_instance ? "true" : "false", type->exts);
    }
    if (type->flags & LYS_SET_FRDIGITS) {
        ypr_close_parent(pctx, &flag);
        ypr_unsigned(pctx, LY_STMT_FRACTION_DIGITS, 0, type->exts, type->fraction_digits);
    }
    LY_ARRAY_FOR(type->bases, u) {
        ypr_close_parent(pctx, &flag);
        ypr_substmt(pctx, LY_STMT_BASE, u, type->bases[u], type->exts);
    }
    LY_ARRAY_FOR(type->types, u) {
        ypr_close_parent(pctx, &flag);
        yprp_type(pctx, &type->types[u]);
    }

    LEVEL--;
    ypr_close(pctx, "type", flag);
}